

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O2

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  long lVar1;
  bool bVar2;
  StringEntry *__tmp;
  StringEntry *pSVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  long *plVar6;
  byte bVar7;
  long lVar8;
  bool bVar9;
  unsigned_long local_2f0;
  StringEntry *se [2];
  DynamicEntryList dentries;
  vector<char,_std::allocator<char>_> bytes;
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  _Vector_base<char,_std::allocator<char>_> local_248;
  ofstream f;
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  zeroPosition[0] = 0;
  zeroPosition[1] = 0;
  zeroSize[0] = 0;
  zeroSize[1] = 0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  cmELF::cmELF((cmELF *)&f,(file->_M_dataplus)._M_p);
  bVar2 = cmELF::Valid((cmELF *)&f);
  if (bVar2) {
    se[0] = (StringEntry *)0x0;
    se[1] = (StringEntry *)0x0;
    pSVar3 = cmELF::GetRPath((cmELF *)&f);
    bVar2 = pSVar3 != (StringEntry *)0x0;
    if (bVar2) {
      se[0] = pSVar3;
    }
    pSVar3 = cmELF::GetRunPath((cmELF *)&f);
    local_2f0 = (ulong)bVar2;
    if (pSVar3 != (StringEntry *)0x0) {
      local_2f0 = (unsigned_long)(bVar2 + 1);
      se[bVar2] = pSVar3;
    }
    pSVar3 = se[0];
    if ((int)local_2f0 == 0) {
      bVar7 = 1;
      bVar9 = false;
      uVar4 = local_2f0;
    }
    else {
      if (((int)local_2f0 == 2) && (se[1]->IndexInSection < se[0]->IndexInSection)) {
        se[0] = se[1];
        se[1] = pSVar3;
      }
      cmELF::GetDynamicEntries(&dentries,(cmELF *)&f);
      bVar9 = dentries.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start !=
              dentries.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      if (bVar9) {
        for (uVar4 = 0; local_2f0 != uVar4; uVar4 = uVar4 + 1) {
          zeroPosition[uVar4] = se[uVar4]->Position;
          zeroSize[uVar4] = se[uVar4]->Size;
        }
        uVar4 = cmELF::GetDynamicEntryPosition((cmELF *)&f,1);
        uVar5 = cmELF::GetDynamicEntryPosition((cmELF *)&f,0);
        lVar8 = 0;
        do {
          while( true ) {
            if (dentries.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                dentries.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
              cmELF::EncodeDynamicEntries
                        ((vector<char,_std::allocator<char>_> *)&local_248,(cmELF *)&f,&dentries);
              std::vector<char,_std::allocator<char>_>::_M_move_assign(&bytes);
              std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_248);
              uVar4 = cmELF::GetDynamicEntryPosition((cmELF *)&f,0);
              goto LAB_0033ef9c;
            }
            lVar1 = (dentries.
                     super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_start)->first;
            if ((lVar1 == 0xf) || (lVar1 == 0x1d)) break;
            if ((lVar1 == 0x70000035) && (bVar2 = cmELF::IsMIPS((cmELF *)&f), bVar2)) {
              (dentries.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->second =
                   (dentries.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->second + lVar8 * (uVar4 - uVar5);
            }
            dentries.
            super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 dentries.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1;
          }
          dentries.
          super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_start =
               (pointer)std::
                        vector<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                        ::erase(&dentries,
                                (const_iterator)
                                dentries.
                                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
          lVar8 = lVar8 + 1;
        } while( true );
      }
      if (emsg != (string *)0x0) {
        std::__cxx11::string::assign((char *)emsg);
      }
      uVar4 = 0;
      local_2f0 = 0;
LAB_0033ef9c:
      std::
      _Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
      ::~_Vector_base(&dentries.
                       super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                     );
      bVar7 = 0;
    }
    bVar2 = true;
  }
  else {
    bVar7 = 0;
    bVar2 = false;
    bVar9 = false;
    uVar4 = 0;
    local_2f0 = 0;
  }
  cmELF::~cmELF((cmELF *)&f);
  if (!bVar9) goto LAB_0033f08c;
  std::ofstream::ofstream(&f,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if (((((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
         [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5)
        == 0) &&
      (plVar6 = (long *)std::ostream::seekp(&f,uVar4,0),
      (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0)) &&
     (plVar6 = (long *)std::ostream::write((char *)&f,
                                           (long)bytes.
                                                 super__Vector_base<char,_std::allocator<char>_>.
                                                 _M_impl.super__Vector_impl_data._M_start),
     (*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) == 0)) {
    uVar4 = 0;
    do {
      if (uVar4 == local_2f0) {
        bVar7 = 1;
        if (removed != (bool *)0x0) {
          *removed = true;
        }
        goto LAB_0033f07b;
      }
      plVar6 = (long *)std::ostream::seekp(&f,zeroPosition[uVar4],0);
      if ((*(byte *)((long)plVar6 + *(long *)(*plVar6 + -0x18) + 0x20) & 5) != 0) break;
      uVar5 = zeroSize[uVar4];
      while (bVar2 = uVar5 != 0, uVar5 = uVar5 - 1, bVar2) {
        std::operator<<(&f.super_basic_ostream<char,_std::char_traits<char>_>,'\0');
      }
      uVar4 = uVar4 + 1;
    } while (((&f.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
              [(long)f.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] &
             5) == 0);
    if (emsg != (string *)0x0) {
      std::__cxx11::string::assign((char *)emsg);
      goto LAB_0033f078;
    }
    bVar7 = 0;
  }
  else {
    if (emsg != (string *)0x0) {
      std::__cxx11::string::assign((char *)emsg);
    }
LAB_0033f078:
    bVar7 = 0;
  }
LAB_0033f07b:
  std::ofstream::~ofstream(&f);
  bVar2 = true;
LAB_0033f08c:
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&bytes.super__Vector_base<char,_std::allocator<char>_>);
  if (bVar2 || removed == (bool *)0x0) {
    bVar2 = (bool)(bVar7 | !bVar2);
  }
  else {
    *removed = false;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
  if (cm::optional<bool> result = RemoveRPathELF(file, emsg, removed)) {
    return result.value();
  }
  if (cm::optional<bool> result = RemoveRPathXCOFF(file, emsg, removed)) {
    return result.value();
  }
  // The file format is not recognized.  Assume it has no RPATH.
  return true;
}